

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTetra>::Append
          (TPZCompElHDiv<pzshape::TPZShapeTetra> *this,TPZFMatrix<double> *u1,TPZFMatrix<double> *u2
          ,TPZFMatrix<double> *u12)

{
  double dVar1;
  int64_t iVar2;
  int64_t iVar3;
  double *pdVar4;
  int64_t iVar5;
  int64_t iVar6;
  ostream *this_00;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  int64_t j;
  int64_t i_1;
  int64_t cu12;
  int64_t ru12;
  int64_t cu2;
  int64_t ru2;
  int64_t cu1;
  int64_t ru1;
  int64_t i;
  int64_t nu2;
  int64_t nu1;
  bool Is_u2PHI;
  bool Is_u1PHI;
  int64_t local_98;
  double in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  TPZFMatrix<double> *in_stack_ffffffffffffff80;
  TPZFMatrix<double> *pTVar7;
  long local_78;
  long local_40;
  
  iVar2 = TPZBaseMatrix::Cols(in_RSI);
  iVar3 = TPZBaseMatrix::Cols(in_RDX);
  if ((iVar2 != 1) || (iVar3 != 1)) {
    if ((iVar2 != 1) || (iVar3 != 1)) {
      iVar2 = TPZBaseMatrix::Rows(in_RSI);
      iVar3 = TPZBaseMatrix::Cols(in_RSI);
      iVar5 = TPZBaseMatrix::Rows(in_RDX);
      iVar6 = TPZBaseMatrix::Cols(in_RDX);
      local_98 = iVar2;
      if (iVar2 < iVar5) {
        local_98 = iVar5;
      }
      (**(code **)(*in_RCX + 0x70))(in_RCX,local_98,iVar3 + iVar6);
      for (local_78 = 0; local_78 < iVar2; local_78 = local_78 + 1) {
        for (pTVar7 = (TPZFMatrix<double> *)0x0; (long)pTVar7 < iVar3;
            pTVar7 = (TPZFMatrix<double> *)
                     ((long)&(pTVar7->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                             _vptr_TPZSavable + 1)) {
          pdVar4 = TPZFMatrix<double>::operator()
                             (pTVar7,(int64_t)in_stack_ffffffffffffff78,
                              (int64_t)in_stack_ffffffffffffff70);
          dVar1 = *pdVar4;
          pdVar4 = TPZFMatrix<double>::operator()
                             (pTVar7,(int64_t)in_stack_ffffffffffffff78,
                              (int64_t)in_stack_ffffffffffffff70);
          *pdVar4 = dVar1;
        }
      }
      for (local_78 = 0; local_78 < iVar5; local_78 = local_78 + 1) {
        for (pTVar7 = (TPZFMatrix<double> *)0x0; (long)pTVar7 < iVar6;
            pTVar7 = (TPZFMatrix<double> *)
                     ((long)&(pTVar7->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                             _vptr_TPZSavable + 1)) {
          pdVar4 = TPZFMatrix<double>::operator()
                             (pTVar7,(int64_t)in_stack_ffffffffffffff78,
                              (int64_t)in_stack_ffffffffffffff70);
          dVar1 = *pdVar4;
          pdVar4 = TPZFMatrix<double>::operator()
                             (pTVar7,(int64_t)in_stack_ffffffffffffff78,
                              (int64_t)in_stack_ffffffffffffff70);
          *pdVar4 = dVar1;
        }
      }
    }
    else {
      this_00 = std::operator<<((ostream *)&std::cerr,"TPZCompElHDiv::Append. Bad input parameters "
                               );
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    iVar2 = TPZBaseMatrix::Rows(in_RSI);
    iVar3 = TPZBaseMatrix::Rows(in_RDX);
    (**(code **)(*in_RCX + 0x70))(in_RCX,iVar2 + iVar3,1);
    for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                          (int64_t)in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff78 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                          (int64_t)in_stack_ffffffffffffff70);
      *pdVar4 = in_stack_ffffffffffffff78;
    }
    for (local_40 = 0; local_40 < iVar3; local_40 = local_40 + 1) {
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                          (int64_t)in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff70 = *pdVar4;
      pdVar4 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff80,(int64_t)in_stack_ffffffffffffff78,
                          (int64_t)in_stack_ffffffffffffff70);
      *pdVar4 = in_stack_ffffffffffffff70;
    }
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::Append(TPZFMatrix<REAL> &u1, TPZFMatrix<REAL> &u2, TPZFMatrix<REAL> &u12)
{

	bool Is_u1PHI = (u1.Cols() == 1) ? true : false;
	bool Is_u2PHI = (u2.Cols() == 1) ? true : false;

	if(Is_u1PHI && Is_u2PHI)
	{
		int64_t nu1 = u1.Rows(),nu2 = u2.Rows();
		u12.Redim(nu1+nu2,1);
		int64_t i;
		for(i=0; i<nu1; i++) u12(i,0) = u1(i,0);
		for(i=0; i<nu2; i++) u12(i+nu1,0) = u2(i,0);


	}
	else if(!Is_u1PHI || !Is_u2PHI)
	{
		int64_t ru1 = u1.Rows(), cu1 = u1.Cols(), ru2 = u2.Rows(), cu2 = u2.Cols();
		int64_t ru12 = ru1 < ru2 ? ru2 : ru1;
		int64_t cu12 = cu1+cu2;
		u12.Redim(ru12,cu12);
		int64_t i,j;
		for(i=0; i<ru1; i++) for(j=0; j<cu1; j++) u12(i,j) = u1(i,j);
		for(i=0; i<ru2; i++) for(j=0; j<cu2; j++) u12(i,j+cu1) = u2(i,j);
	}
	else
	{
		PZError << "TPZCompElHDiv::Append. Bad input parameters " << std::endl;

	}

}